

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell>::
emplace_back<slang::ast::DefinitionSymbol_const&,slang::SourceRange>
          (SmallVectorBase<slang::ast::ConfigBlockSymbol::TopCell> *this,DefinitionSymbol *args,
          SourceRange *args_1)

{
  SourceLocation *pSVar1;
  ulong uVar2;
  pointer p;
  SourceLocation SVar3;
  SourceLocation SVar4;
  DefinitionSymbol *pDVar5;
  ConfigRule *pCVar6;
  pointer pTVar7;
  pointer pTVar8;
  pointer pTVar9;
  long lVar10;
  ulong uVar11;
  pointer __src;
  size_type sVar12;
  long lVar13;
  
  __src = this->data_ + this->len;
  if (this->len != this->cap) {
    SVar3 = args_1->startLoc;
    SVar4 = args_1->endLoc;
    __src->definition = args;
    __src->rule = (ConfigRule *)0x0;
    (__src->sourceRange).startLoc = SVar3;
    (__src->sourceRange).endLoc = SVar4;
    sVar12 = this->len;
    this->len = sVar12 + 1;
    return this->data_ + sVar12;
  }
  if (this->len == 0x3ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar11 = this->len + 1;
  uVar2 = this->cap;
  if (uVar11 < uVar2 * 2) {
    uVar11 = uVar2 * 2;
  }
  if (0x3ffffffffffffff - uVar2 < uVar2) {
    uVar11 = 0x3ffffffffffffff;
  }
  lVar13 = (long)__src - (long)this->data_;
  pTVar7 = (pointer)operator_new(uVar11 << 5);
  *(DefinitionSymbol **)((long)pTVar7 + lVar13) = args;
  *(undefined8 *)((long)pTVar7 + lVar13 + 8) = 0;
  SVar3 = args_1->endLoc;
  pSVar1 = (SourceLocation *)((long)pTVar7 + lVar13 + 0x10);
  *pSVar1 = args_1->startLoc;
  pSVar1[1] = SVar3;
  p = this->data_;
  sVar12 = this->len;
  lVar10 = (long)p + (sVar12 * 0x20 - (long)__src);
  pTVar8 = p;
  pTVar9 = pTVar7;
  if (lVar10 == 0) {
    pTVar8 = pTVar7;
    pTVar9 = p;
    if (sVar12 != 0) {
      do {
        pDVar5 = pTVar9->definition;
        pCVar6 = pTVar9->rule;
        SVar3 = (pTVar9->sourceRange).endLoc;
        (pTVar8->sourceRange).startLoc = (pTVar9->sourceRange).startLoc;
        (pTVar8->sourceRange).endLoc = SVar3;
        pTVar8->definition = pDVar5;
        pTVar8->rule = pCVar6;
        pTVar9 = pTVar9 + 1;
        pTVar8 = pTVar8 + 1;
      } while (pTVar9 != __src);
    }
  }
  else {
    for (; pTVar8 != __src; pTVar8 = pTVar8 + 1) {
      pDVar5 = pTVar8->definition;
      pCVar6 = pTVar8->rule;
      SVar3 = (pTVar8->sourceRange).endLoc;
      (pTVar9->sourceRange).startLoc = (pTVar8->sourceRange).startLoc;
      (pTVar9->sourceRange).endLoc = SVar3;
      pTVar9->definition = pDVar5;
      pTVar9->rule = pCVar6;
      pTVar9 = pTVar9 + 1;
    }
    memcpy((void *)((long)pTVar7 + lVar13 + 0x20),__src,(lVar10 - 0x20U & 0xffffffffffffffe0) + 0x20
          );
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
    sVar12 = this->len;
  }
  this->len = sVar12 + 1;
  this->cap = uVar11;
  this->data_ = pTVar7;
  return (reference)((long)pTVar7 + lVar13);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }